

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

void __thiscall VcprojGenerator::~VcprojGenerator(VcprojGenerator *this)

{
  ~VcprojGenerator(this);
  operator_delete(this,0x3bd0);
  return;
}

Assistant:

VcprojGenerator::~VcprojGenerator()
{
    delete projectWriter;
}